

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl.cpp
# Opt level: O2

LiveGLSL * LiveGLSLCreate(Arguments *args)

{
  uint32_t uVar1;
  int iVar2;
  LiveGLSL *this;
  HFileWatcher pvVar3;
  GLFWwindow *handle;
  HGUI pvVar4;
  int fb_height;
  string shader_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  this = (LiveGLSL *)operator_new(0xf0);
  memset(this,0,0xf0);
  LiveGLSL::LiveGLSL(this);
  LOCK();
  (this->ShaderFileChanged)._M_base._M_i = false;
  UNLOCK();
  pvVar3 = FileWatcherCreate(OnShaderChange,this,0x10);
  this->FileWatcher = pvVar3;
  this->ShaderCompiled = false;
  std::__cxx11::string::_M_assign((string *)&this->ShaderPath);
  uVar1 = args->Height;
  this->WindowWidth = args->Width;
  this->WindowHeight = uVar1;
  this->IsContinuousRendering = false;
  Arguments::operator=(&this->Args,args);
  ExtractBasePath(&shader_name,&args->Input);
  std::__cxx11::string::operator=((string *)&this->BasePath,(string *)&shader_name);
  std::__cxx11::string::~string((string *)&shader_name);
  if ((this->Args).EnableIni == true) {
    ExtractFilenameWithoutExt(&shader_name,&args->Input);
    std::operator+(&local_88,&this->BasePath,"/");
    std::operator+(&local_68,&local_88,&shader_name);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fb_height,
                   &local_68,".ini");
    GUIComponentLoad((string *)&fb_height,
                     (vector<GUIComponent,_std::allocator<GUIComponent>_> *)this);
    std::__cxx11::string::~string((string *)&fb_height);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&shader_name);
  }
  iVar2 = glfwInit();
  if (iVar2 != 0) {
    glfwWindowHint(0x22002,3);
    glfwWindowHint(0x22003,2);
    glfwWindowHint(0x22006,1);
    glfwWindowHint(0x22008,0x32001);
    glfwWindowHint(0x2100d,4);
    handle = glfwCreateWindow(this->WindowWidth,this->WindowHeight,"live-glsl",(GLFWmonitor *)0x0,
                              (GLFWwindow *)0x0);
    this->GLFWWindowHandle = handle;
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSetWindowUserPointer(this->GLFWWindowHandle,this);
      glfwSetErrorCallback(LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetWindowSizeCallback
                (this->GLFWWindowHandle,LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetFramebufferSizeCallback
                (this->GLFWWindowHandle,LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetKeyCallback(this->GLFWWindowHandle,LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetDropCallback(this->GLFWWindowHandle,LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      glfwSetMouseButtonCallback
                (this->GLFWWindowHandle,LiveGLSLCreate::anon_class_1_0_00000001::__invoke);
      shader_name._M_dataplus._M_p._0_4_ = 0;
      fb_height = 0;
      glfwGetFramebufferSize(this->GLFWWindowHandle,(int *)&shader_name,&fb_height);
      this->PixelDensity = (float)(int)shader_name._M_dataplus._M_p / (float)this->WindowWidth;
      gladLoadGL(glfwGetProcAddress);
      glfwSwapInterval(1);
      pvVar4 = GUIInit(this->GLFWWindowHandle,args->Width,args->Height);
      this->GUI = pvVar4;
      std::__cxx11::string::string((string *)&local_48,(string *)args);
      ReloadShaderIfChanged(this,&local_48,true);
      std::__cxx11::string::~string((string *)&local_48);
      (*glad_glClearColor)(0.21,0.39,0.74,1.0);
      shader_name.field_2._M_allocated_capacity = 0x3f8000003f800000;
      shader_name.field_2._8_8_ = 0x3f800000bf800000;
      shader_name._M_dataplus._M_p._0_4_ = 0xbf800000;
      shader_name._M_dataplus._M_p._4_4_ = 0x3f800000;
      shader_name._M_string_length._0_4_ = 0x3f800000;
      shader_name._M_string_length._4_4_ = 0xbf800000;
      (*glad_glGenVertexArrays)(1,&this->VaoId);
      (*glad_glBindVertexArray)(this->VaoId);
      (*glad_glGenBuffers)(1,&this->VertexBufferId);
      (*glad_glBindBuffer)(0x8892,this->VertexBufferId);
      (*glad_glBufferData)(0x8892,0x30,&shader_name,0x88e4);
      return this;
    }
  }
  glfwTerminate();
  exit(1);
}

Assistant:

LiveGLSL* LiveGLSLCreate(const Arguments& args) {
    LiveGLSL* live_glsl = new LiveGLSL();

    live_glsl->ShaderFileChanged.store(false);
    live_glsl->FileWatcher = FileWatcherCreate(OnShaderChange, live_glsl, 16);
    live_glsl->ShaderCompiled = false;
    live_glsl->ShaderPath = args.Input;
    live_glsl->WindowWidth = args.Width;
    live_glsl->WindowHeight = args.Height;
    live_glsl->IsContinuousRendering = false;
    live_glsl->Args = args;
    live_glsl->BasePath = ExtractBasePath(args.Input);
    
    if (live_glsl->Args.EnableIni) {
        std::string shader_name = ExtractFilenameWithoutExt(args.Input);
        GUIComponentLoad(live_glsl->BasePath + "/" + shader_name + ".ini", live_glsl->GUIComponents);
    }

    // Init GLFW Window
    {
        if (!glfwInit()) {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 3);
        glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 2);
        glfwWindowHint(GLFW_OPENGL_FORWARD_COMPAT, GL_TRUE);
        glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
        glfwWindowHint(GLFW_SAMPLES, 4);

        live_glsl->GLFWWindowHandle = glfwCreateWindow(live_glsl->WindowWidth, live_glsl->WindowHeight, "live-glsl", NULL, NULL);
        if (!live_glsl->GLFWWindowHandle) {
            glfwTerminate();
            exit(EXIT_FAILURE);
        }

        glfwMakeContextCurrent(live_glsl->GLFWWindowHandle);
        glfwSetWindowUserPointer(live_glsl->GLFWWindowHandle, live_glsl);
        glfwSetErrorCallback([](int error, const char* description) {
            fprintf(stderr, "Error: %s\n", description);
        });

        glfwSetWindowSizeCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int width, int height) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            live_glsl->WindowWidth = width;
            live_glsl->WindowHeight = height;
        });

        glfwSetFramebufferSizeCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int fb_width, int fb_height) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            int window_width = 0;
            int window_height = 0;
            glfwGetWindowSize(live_glsl->GLFWWindowHandle, &window_width, &window_height);
            live_glsl->PixelDensity = (float)fb_width / (float)window_width;
            GUIResize(live_glsl->GUI, window_width, window_height);
        });

        glfwSetKeyCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int key, int scancode, int action, int mods) {
            if (key == GLFW_KEY_ESCAPE) glfwSetWindowShouldClose(window, GL_TRUE);
            GUIKeyCallback(window, key, scancode, action, mods);
        });

        glfwSetDropCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int count, const char** paths) {
            if (count >= 0) {
                LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
                std::string path = std::string(paths[0]);
                live_glsl->ShaderPath = path;
                live_glsl->Args.Input = path;
                live_glsl->BasePath = ExtractBasePath(path);

                ReloadShaderIfChanged(live_glsl, path, true);
            }
        });
        
        glfwSetMouseButtonCallback(live_glsl->GLFWWindowHandle, [](GLFWwindow* window, int button, int action, int mods) {
            LiveGLSL* live_glsl = static_cast<LiveGLSL*>(glfwGetWindowUserPointer(window));
            GUIMouseButtonCallback(live_glsl->GUI, button, action, mods);
        });

        int fb_width = 0;
        int fb_height = 0;
        glfwGetFramebufferSize(live_glsl->GLFWWindowHandle, &fb_width, &fb_height);
        live_glsl->PixelDensity = (float)fb_width / (float)live_glsl->WindowWidth;
        gladLoadGL(glfwGetProcAddress);
        glfwSwapInterval(1);
    }

    live_glsl->GUI = GUIInit(live_glsl->GLFWWindowHandle, args.Width, args.Height);

    ReloadShaderIfChanged(live_glsl, args.Input, true);

    // Init GL
    {
        glClearColor(0.21, 0.39, 0.74, 1.0);
        const float vertices[] = {
            -1.0f,  1.0f,
             1.0f, -1.0f,
             1.0f,  1.0f,
            -1.0f,  1.0f,
            -1.0f, -1.0f,
             1.0f, -1.0f,
        };

        glGenVertexArrays(1, &live_glsl->VaoId);
        glBindVertexArray(live_glsl->VaoId);
        glGenBuffers(1, &live_glsl->VertexBufferId);
        glBindBuffer(GL_ARRAY_BUFFER, live_glsl->VertexBufferId);
        glBufferData(GL_ARRAY_BUFFER, sizeof(vertices), vertices, GL_STATIC_DRAW);
    }

    return live_glsl;
}